

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall PrintStatement::print(PrintStatement *this)

{
  bool bVar1;
  Testlist *this_00;
  reference ppEVar2;
  ExprNode *exprNode;
  iterator __end1;
  iterator __begin1;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> *__range1;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> testlist;
  PrintStatement *this_local;
  
  testlist.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::operator<<((ostream *)&std::cout,"print ");
  this_00 = testList(this);
  Testlist::getTestlist((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&__range1,this_00);
  __end1 = std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::begin
                     ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&__range1);
  exprNode = (ExprNode *)
             std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::end
                       ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ExprNode_**,_std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>_>
                                *)&exprNode);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<ExprNode_**,_std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>_>
              ::operator*(&__end1);
    (**(*ppEVar2)->_vptr_ExprNode)();
    std::operator<<((ostream *)&std::cout,", ");
    __gnu_cxx::__normal_iterator<ExprNode_**,_std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\b\b ");
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::~vector
            ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&__range1);
  return;
}

Assistant:

void PrintStatement::print() {
    std::cout << "print ";
    std::vector<ExprNode*>testlist = testList()->getTestlist();
    for(ExprNode* exprNode : testlist){
        exprNode->print();
        std::cout << ", ";
    }
    std::cout << "\b\b ";
    std::cout << std::endl;

}